

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::EOR_AB_X(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  byte bVar4;
  
  this->cycles = 4;
  uVar2 = GetWord(this);
  this->cycles = this->cycles - 1;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(ushort)(this->X + uVar2));
  bVar1 = this->A;
  bVar4 = bVar1 ^ (byte)iVar3;
  this->A = bVar4;
  (this->field_6).ps = bVar4 & 0x80 | (bVar1 == (byte)iVar3) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::EOR_AB_X()
{
    cycles = 4;
    uint16_t address = GetWord();
    A ^= ReadByte(address + X);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}